

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O2

void __thiscall
RandomWordTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
::populate(RandomWordTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
           *this)

{
  vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
  *this_00;
  pointer pbVar1;
  __normal_iterator<signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  _Var2;
  uint uVar3;
  result_type rVar4;
  size_t length;
  uniform_int_distribution<unsigned_int> word_length_distribution;
  uniform_int_distribution<unsigned_int> word_count_distribution;
  mt19937 randgen;
  ulong local_1418;
  param_type local_1408;
  param_type local_1400;
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_> local_13f8;
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_> local_13d8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  this_00 = &this->m_tokens;
  std::
  vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
  ::clear(this_00);
  (this->m_str)._M_string_length = 0;
  *(this->m_str)._M_dataplus._M_p = '\0';
  uVar3 = std::chrono::_V2::system_clock::now();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13b8,(ulong)uVar3);
  local_1400._M_a = 5;
  local_1400._M_b = 0x40;
  local_1408._M_a = 0;
  local_1408._M_b = 0x10;
  local_1418 = this->m_fixed_word_count;
  if (local_1418 == 0) {
    rVar4 = std::uniform_int_distribution<unsigned_int>::operator()
                      ((uniform_int_distribution<unsigned_int> *)&local_1400,&local_13b8);
    local_1418 = (ulong)rVar4;
  }
  while ((ulong)((long)(this->m_tokens).
                       super__Vector_base<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_tokens).
                       super__Vector_base<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5) < local_1418) {
    length = this->m_fixed_word_length;
    if (length == 0) {
      rVar4 = std::uniform_int_distribution<unsigned_int>::operator()
                        ((uniform_int_distribution<unsigned_int> *)&local_1408,&local_13b8);
      length = (size_t)rVar4;
    }
    std::__cxx11::
    basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::
    basic_string(&local_13d8,&this->m_delim);
    make_word<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_nullptr>
              (&local_13f8,&local_13d8,length);
    std::
    vector<std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>,std::allocator<std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>>
    ::
    emplace_back<std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>
              ((vector<std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>,std::allocator<std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>>
                *)this_00,&local_13f8);
    std::__cxx11::
    basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::
    ~basic_string(&local_13f8);
    std::__cxx11::
    basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::
    ~basic_string(&local_13d8);
    if ((this->m_tokens).
        super__Vector_base<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length == 0) {
      std::
      vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
      ::pop_back(this_00);
    }
    else {
      local_13f8._M_dataplus._M_p = (pointer)(this->m_str)._M_string_length;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&this->m_token_indexes,(unsigned_long *)&local_13f8);
      pbVar1 = (this->m_tokens).
               super__Vector_base<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      _Var2._M_current = pbVar1[-1]._M_dataplus._M_p;
      std::__cxx11::
      basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>::
      insert<__gnu_cxx::__normal_iterator<signed_char*,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>,void>
                ((basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>
                  *)&this->m_str,
                 (const_iterator)((this->m_str)._M_dataplus._M_p + (this->m_str)._M_string_length),
                 _Var2,(__normal_iterator<signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
                        )(_Var2._M_current + pbVar1[-1]._M_string_length));
    }
    _Var2._M_current = (this->m_delim)._M_dataplus._M_p;
    std::__cxx11::
    basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>::
    insert<__gnu_cxx::__normal_iterator<signed_char*,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>,void>
              ((basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>
                *)&this->m_str,
               (const_iterator)((this->m_str)._M_dataplus._M_p + (this->m_str)._M_string_length),
               _Var2,(__normal_iterator<signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
                      )(_Var2._M_current + (this->m_delim)._M_string_length));
  }
  return;
}

Assistant:

void populate() {
		m_tokens.clear();
		m_str.clear();

		std::mt19937 randgen(static_cast<unsigned int>(std::chrono::system_clock::now().time_since_epoch().count()));
		std::uniform_int_distribution<uint32_t> word_count_distribution(5, 64);
		std::uniform_int_distribution<uint32_t> word_length_distribution(0, 16);

		auto word_count = m_fixed_word_count;
		if (word_count == 0) {
			word_count = word_count_distribution(randgen);
		}

		while (m_tokens.size() < word_count) {
			auto word_length = m_fixed_word_length;
			if (word_length == 0) {
				word_length = word_length_distribution(randgen);
			}
			m_tokens.push_back(make_word<T, StringT>(m_delim, word_length));
			if (m_tokens.back().empty()) {
				m_tokens.pop_back();
			}
			else {
				m_token_indexes.push_back(m_str.size());
				m_str.insert(m_str.end(), m_tokens.back().begin(), m_tokens.back().end());
			}
			m_str.insert(m_str.end(), m_delim.begin(), m_delim.end());
		}
	}